

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containersNative.cpp
# Opt level: O1

void chatra::emb::containers::byteArray_remove(Ct *ct)

{
  pointer *ppuVar1;
  __atomic_flag_data_type _Var2;
  pointer puVar3;
  pointer puVar4;
  int iVar5;
  undefined4 extraout_var;
  size_t sVar6;
  pointer __src;
  ByteArrayData *this;
  
  iVar5 = (*ct->_vptr_NativeCallContext[5])();
  this = (ByteArrayData *)CONCAT44(extraout_var,iVar5);
  do {
    LOCK();
    _Var2 = (this->super_ByteArray).lock.flag.super___atomic_flag_base._M_i;
    (this->super_ByteArray).lock.flag.super___atomic_flag_base._M_i = true;
    UNLOCK();
  } while (_Var2 != false);
  sVar6 = ByteArrayData::fetchIndex(this,ct,0,false);
  (*ct->_vptr_NativeCallContext[0xe])
            (ct,(ulong)(this->super_ByteArray).data.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start[sVar6]);
  puVar3 = (this->super_ByteArray).data.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (this->super_ByteArray).data.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __src = puVar3 + sVar6 + 1;
  if (__src != puVar4) {
    memmove(puVar3 + sVar6,__src,(long)puVar4 - (long)__src);
  }
  ppuVar1 = &(this->super_ByteArray).data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppuVar1 = *ppuVar1 + -1;
  (this->super_ByteArray).lock.flag.super___atomic_flag_base._M_i = false;
  return;
}

Assistant:

static void byteArray_remove(Ct& ct) {
	auto* self = ct.self<ByteArrayData>();
	std::lock_guard<SpinLock> lock(self->lock);
	auto position = self->fetchIndex(ct, 0, false);
	ct.set(self->data[position]);
	self->data.erase(self->data.cbegin() + position);
}